

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_unix.c
# Opt level: O0

int funchook_unprotect_begin(funchook_t *funchook,mem_state_t *mstate,void *start,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  long in_RCX;
  ulong in_RDX;
  ulong *in_RSI;
  funchook_t *in_RDI;
  char *pcVar6;
  int rv;
  size_t saddr;
  char errbuf [128];
  char *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  int errnum;
  int local_4;
  
  errnum = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  *in_RSI = in_RDX & 0xfffffffffffff000;
  in_RSI[1] = (in_RCX + in_RDX) - (in_RDX & 0xfffffffffffff000);
  in_RSI[1] = in_RSI[1] + 0xfff & 0xfffffffffffff000;
  iVar3 = mprotect((void *)*in_RSI,in_RSI[1],funchook_unprotect_begin::prot);
  if (iVar3 == 0) {
    pcVar6 = "";
    if ((funchook_unprotect_begin::prot & 4U) != 0) {
      pcVar6 = ",exec";
    }
    funchook_log(in_RDI,"  unprotect memory %p (size=%lu, prot=read,write%s) <- %p (size=%lu)\n",
                 *in_RSI,in_RSI[1],pcVar6,in_RDX,in_RCX);
    local_4 = 0;
  }
  else if ((((iVar3 == -1) && (piVar4 = __errno_location(), *piVar4 == 0xd)) &&
           ((funchook_unprotect_begin::prot & 4U) != 0)) &&
          (iVar3 = mprotect((void *)*in_RSI,in_RSI[1],3), iVar3 == 0)) {
    funchook_unprotect_begin::prot = 3;
    funchook_log(in_RDI,"  unprotect memory %p (size=%lu, prot=read,write) <- %p (size=%lu)\n",
                 *in_RSI,in_RSI[1],in_RDX,in_RCX);
    local_4 = 0;
  }
  else {
    uVar1 = *in_RSI;
    uVar2 = in_RSI[1];
    pcVar6 = "";
    if ((funchook_unprotect_begin::prot & 4U) != 0) {
      pcVar6 = ",exec";
    }
    __errno_location();
    pcVar5 = funchook_strerror(errnum,in_stack_ffffffffffffff08,0x103455);
    funchook_set_error_message
              (in_RDI,
               "Failed to unprotect memory %p (size=%lu, prot=read,write%s) <- %p (size=%lu, error=%s)"
               ,uVar1,uVar2,pcVar6,in_RDX,in_RCX,pcVar5);
    local_4 = 9;
  }
  return local_4;
}

Assistant:

int funchook_unprotect_begin(funchook_t *funchook, mem_state_t *mstate, void *start, size_t len)
{
    static int prot = PROT_READ | PROT_WRITE | PROT_EXEC;
    char errbuf[128];
    size_t saddr = ROUND_DOWN((size_t)start, page_size);
    int rv;

    mstate->addr = (void*)saddr;
    mstate->size = len + (size_t)start - saddr;
    mstate->size = ROUND_UP(mstate->size, page_size);
    rv = mprotect(mstate->addr, mstate->size, prot);
    if (rv == 0) {
        funchook_log(funchook, "  unprotect memory %p (size=%"PRIuPTR", prot=read,write%s) <- %p (size=%"PRIuPTR")\n",
                     mstate->addr, mstate->size, (prot & PROT_EXEC) ? ",exec" : "", start, len);
        return 0;
    }
    if (rv == -1 && errno == EACCES && (prot & PROT_EXEC)) {
        rv = mprotect(mstate->addr, mstate->size, PROT_READ | PROT_WRITE);
        if (rv == 0) {
            prot = PROT_READ | PROT_WRITE;
            funchook_log(funchook, "  unprotect memory %p (size=%"PRIuPTR", prot=read,write) <- %p (size=%"PRIuPTR")\n",
                         mstate->addr, mstate->size, start, len);
            return 0;
        }
    }
    funchook_set_error_message(funchook, "Failed to unprotect memory %p (size=%"PRIuPTR", prot=read,write%s) <- %p (size=%"PRIuPTR", error=%s)",
                               mstate->addr, mstate->size, (prot & PROT_EXEC) ? ",exec" : "", start, len,
                               funchook_strerror(errno, errbuf, sizeof(errbuf)));
    return FUNCHOOK_ERROR_MEMORY_FUNCTION;
}